

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O0

void getnameinfo_cb(uv_getnameinfo_t *handle,int status,char *hostname,char *service)

{
  void *eval_b_2;
  void *eval_a_2;
  void *eval_b_1;
  void *eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  char *service_local;
  char *hostname_local;
  int status_local;
  uv_getnameinfo_t *handle_local;
  
  if ((long)status != -0xbbb) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0x92,"status","==","UV_EAI_CANCELED",(long)status,"==",0xfffffffffffff445);
    abort();
  }
  if (hostname != (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0x93,"hostname","==","NULL",hostname,"==",0);
    abort();
  }
  if (service != (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0x94,"service","==","NULL",service,"==",0);
    abort();
  }
  return;
}

Assistant:

static void getnameinfo_cb(uv_getnameinfo_t* handle,
                           int status,
                           const char* hostname,
                           const char* service) {
  ASSERT_EQ(status, UV_EAI_CANCELED);
  ASSERT_NULL(hostname);
  ASSERT_NULL(service);
}